

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_attr_set_tiledesc(exr_context_t ctxt,int part_index,char *name,exr_attr_tiledesc_t *val)

{
  exr_attribute_t *peVar1;
  int iVar2;
  exr_result_t eVar3;
  exr_context_t in_RCX;
  exr_attribute_list_t *in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  exr_attribute_list_t *unaff_retaddr;
  exr_context_t in_stack_00000008;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_attribute_t **in_stack_00000020;
  exr_result_t rv;
  exr_attribute_t *attr;
  undefined8 in_stack_ffffffffffffffc0;
  exr_tile_round_mode_t round_mode;
  exr_tile_level_mode_t in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  undefined8 in_stack_ffffffffffffffd0;
  exr_attribute_t **out;
  undefined4 in_stack_ffffffffffffffe8;
  _internal_exr_context *p_Var4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  round_mode = (exr_tile_round_mode_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  if ((in_RDX == (exr_attribute_list_t *)0x0) ||
     (iVar2 = strcmp((char *)in_RDX,"tiles"), iVar2 != 0)) {
    out = (exr_attribute_t **)0x0;
    if (in_RDI == (_internal_exr_context *)0x0) {
      iVar2 = 2;
    }
    else {
      p_Var4 = in_RDI;
      internal_exr_lock(in_RDI);
      if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
        internal_exr_unlock(in_RDI);
        iVar2 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
      }
      else if (in_RDI->mode == '\0') {
        internal_exr_unlock(in_RDI);
        iVar2 = (*in_RDI->standard_error)(in_RDI,8);
      }
      else if (in_RDI->mode == '\x03') {
        internal_exr_unlock(in_RDI);
        iVar2 = (*in_RDI->standard_error)(in_RDI,0x15);
      }
      else {
        eVar3 = exr_attr_list_find_by_name
                          ((exr_const_context_t)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                           (char *)in_RCX,out);
        if (eVar3 == 0xf) {
          if (in_RDI->mode != '\x01') {
            internal_exr_unlock(in_RDI);
            return eVar3;
          }
          iVar2 = exr_attr_list_add(in_stack_00000008,unaff_retaddr,
                                    (char *)CONCAT44(in_stack_fffffffffffffffc,
                                                     in_stack_fffffffffffffff8),
                                    (exr_attribute_type_t)((ulong)p_Var4 >> 0x20),(int32_t)p_Var4,
                                    (uint8_t **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                    in_stack_00000020);
        }
        else {
          if (eVar3 != 0) {
            internal_exr_unlock(in_RDI);
            return eVar3;
          }
          iVar2 = 0;
          if (*(int *)((long)out + 0x14) != 0x15) {
            internal_exr_unlock(in_RDI);
            eVar3 = (*in_RDI->print_error)
                              (in_RDI,0x10,
                               "\'%s\' requested type \'tiledesc\', but stored attributes is type \'%s\'"
                               ,in_RDX,out[1]);
            return eVar3;
          }
        }
        if (in_RCX == (exr_context_t)0x0) {
          internal_exr_unlock(in_RDI);
          iVar2 = (*in_RDI->print_error)
                            (in_RDI,3,"No input value for setting \'%s\', type \'%s\'",in_RDX,
                             "tiledesc");
        }
        else {
          if (iVar2 == 0) {
            peVar1 = out[3];
            peVar1->name = *(char **)in_RCX;
            *(_priv_exr_context_t *)&peVar1->type_name = in_RCX[8];
          }
          internal_exr_unlock(in_RDI);
        }
      }
    }
  }
  else if (in_RCX == (exr_context_t)0x0) {
    iVar2 = 3;
  }
  else {
    iVar2 = exr_set_tile_descriptor
                      (in_RCX,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                       (uint32_t)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                       in_stack_ffffffffffffffc8,round_mode);
  }
  return iVar2;
}

Assistant:

exr_result_t
exr_attr_set_tiledesc (
    exr_context_t              ctxt,
    int                        part_index,
    const char*                name,
    const exr_attr_tiledesc_t* val)
{
    if (name && 0 == strcmp (name, EXR_REQ_TILES_STR))
    {
        if (!val) return EXR_ERR_INVALID_ARGUMENT;
        return exr_set_tile_descriptor (
            ctxt,
            part_index,
            val->x_size,
            val->y_size,
            EXR_GET_TILE_LEVEL_MODE (*val),
            EXR_GET_TILE_ROUND_MODE (*val));
    }

    ATTR_SET_IMPL_DEREF (EXR_ATTR_TILEDESC, tiledesc);
}